

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O2

void __thiscall helics::tcp::TcpComms::TcpComms(TcpComms *this)

{
  NetworkCommsInterface::NetworkCommsInterface(&this->super_NetworkCommsInterface,TCP,dual);
  (this->super_NetworkCommsInterface).super_CommsInterface._vptr_CommsInterface =
       (_func_int **)&PTR__TcpComms_004c3018;
  this->reuse_address = false;
  (this->encryption_config)._M_dataplus._M_p = (pointer)&(this->encryption_config).field_2;
  (this->encryption_config)._M_string_length = 0;
  (this->encryption_config).field_2._M_local_buf[0] = '\0';
  gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  BlockingQueue(&this->rxMessageQueue);
  return;
}

Assistant:

TcpComms::TcpComms() noexcept: NetworkCommsInterface(gmlc::networking::InterfaceTypes::TCP) {}